

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::ImageCreateInfo::ImageCreateInfo
          (ImageCreateInfo *this,VkImageType _imageType,VkFormat _format,VkExtent3D _extent,
          deUint32 _mipLevels,deUint32 _arrayLayers,VkSampleCountFlagBits _samples,
          VkImageTiling _tiling,VkImageUsageFlags _usage,VkSharingMode _sharingMode,
          deUint32 _queueFamilyIndexCount,deUint32 *_pQueueFamilyIndices,VkImageCreateFlags _flags,
          VkImageLayout _initialLayout)

{
  size_type sVar1;
  reference pvVar2;
  allocator<unsigned_int> local_59;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  deUint32 local_3c;
  VkFormat local_38;
  deUint32 _mipLevels_local;
  VkFormat _format_local;
  VkImageType _imageType_local;
  ImageCreateInfo *this_local;
  deUint32 local_1c;
  undefined8 local_14;
  VkExtent3D _extent_local;
  
  local_1c = _extent.depth;
  register0x00000008 = _extent._0_8_;
  local_3c = _mipLevels;
  local_38 = _format;
  _mipLevels_local = _imageType;
  __format_local = this;
  local_14 = register0x00000008;
  _extent_local.width = local_1c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_queueFamilyIndices);
  if (_queueFamilyIndexCount != 0) {
    std::allocator<unsigned_int>::allocator(&local_59);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,_pQueueFamilyIndices,
               _pQueueFamilyIndices + _queueFamilyIndexCount,&local_59);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->m_queueFamilyIndices,&local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
    std::allocator<unsigned_int>::~allocator(&local_59);
  }
  (this->super_VkImageCreateInfo).sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  (this->super_VkImageCreateInfo).pNext = (void *)0x0;
  (this->super_VkImageCreateInfo).flags = _flags;
  (this->super_VkImageCreateInfo).imageType = _mipLevels_local;
  (this->super_VkImageCreateInfo).format = local_38;
  (this->super_VkImageCreateInfo).extent.width = (undefined4)local_14;
  (this->super_VkImageCreateInfo).extent.height = local_14._4_4_;
  (this->super_VkImageCreateInfo).extent.depth = _extent_local.width;
  (this->super_VkImageCreateInfo).mipLevels = local_3c;
  (this->super_VkImageCreateInfo).arrayLayers = _arrayLayers;
  (this->super_VkImageCreateInfo).samples = _samples;
  (this->super_VkImageCreateInfo).tiling = _tiling;
  (this->super_VkImageCreateInfo).usage = _usage;
  (this->super_VkImageCreateInfo).sharingMode = _sharingMode;
  (this->super_VkImageCreateInfo).queueFamilyIndexCount = _queueFamilyIndexCount;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_queueFamilyIndices);
  if (sVar1 == 0) {
    (this->super_VkImageCreateInfo).pQueueFamilyIndices = (deUint32 *)0x0;
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_queueFamilyIndices,0);
    (this->super_VkImageCreateInfo).pQueueFamilyIndices = pvVar2;
  }
  (this->super_VkImageCreateInfo).initialLayout = _initialLayout;
  return;
}

Assistant:

ImageCreateInfo::ImageCreateInfo (vk::VkImageType			_imageType,
								  vk::VkFormat				_format,
								  vk::VkExtent3D			_extent,
								  deUint32					_mipLevels,
								  deUint32					_arrayLayers,
								  vk::VkSampleCountFlagBits	_samples,
								  vk::VkImageTiling			_tiling,
								  vk::VkImageUsageFlags		_usage,
								  vk::VkSharingMode			_sharingMode,
								  deUint32					_queueFamilyIndexCount,
								  const deUint32*			_pQueueFamilyIndices,
								  vk::VkImageCreateFlags	_flags,
								  vk::VkImageLayout			_initialLayout)
{
	if (_queueFamilyIndexCount)
	{
		m_queueFamilyIndices = std::vector<deUint32>(_pQueueFamilyIndices, _pQueueFamilyIndices + _queueFamilyIndexCount);
	}

	sType = vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= _flags;
	imageType				= _imageType;
	format					= _format;
	extent					= _extent;
	mipLevels				= _mipLevels;
	arrayLayers				= _arrayLayers;
	samples					= _samples;
	tiling					= _tiling;
	usage					= _usage;
	sharingMode				= _sharingMode;
	queueFamilyIndexCount	= _queueFamilyIndexCount;

	if (m_queueFamilyIndices.size())
	{
		pQueueFamilyIndices = &m_queueFamilyIndices[0];
	}
	else
	{
		pQueueFamilyIndices = DE_NULL;
	}
	initialLayout	= _initialLayout;
}